

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  int *piVar1;
  char *pcVar2;
  ImGuiContext *pIVar3;
  size_t __n;
  char *__dest;
  int iVar4;
  ImGuiContext *ctx;
  int iVar5;
  
  pIVar3 = GImGui;
  pcVar2 = (GImGui->ClipboardHandlerData).Data;
  if (pcVar2 != (char *)0x0) {
    (pIVar3->ClipboardHandlerData).Size = 0;
    (pIVar3->ClipboardHandlerData).Capacity = 0;
    piVar1 = &(pIVar3->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + -1;
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    (pIVar3->ClipboardHandlerData).Data = (char *)0x0;
  }
  __n = strlen(text);
  iVar4 = (int)__n + 1;
  iVar5 = (pIVar3->ClipboardHandlerData).Capacity;
  if (iVar5 == 0) {
    iVar5 = 8;
  }
  else {
    iVar5 = iVar5 / 2 + iVar5;
  }
  if (iVar5 <= iVar4) {
    iVar5 = iVar4;
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar5,GImAllocatorUserData);
  pcVar2 = (pIVar3->ClipboardHandlerData).Data;
  if (pcVar2 != (char *)0x0) {
    memcpy(__dest,pcVar2,(long)(pIVar3->ClipboardHandlerData).Size);
    pcVar2 = (pIVar3->ClipboardHandlerData).Data;
    if ((pcVar2 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
  }
  (pIVar3->ClipboardHandlerData).Data = __dest;
  (pIVar3->ClipboardHandlerData).Capacity = iVar5;
  (pIVar3->ClipboardHandlerData).Size = iVar4;
  memcpy(__dest,text,__n);
  (pIVar3->ClipboardHandlerData).Data[(int)__n] = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.ClipboardHandlerData.clear();
    const char* text_end = text + strlen(text);
    g.ClipboardHandlerData.resize((int)(text_end - text) + 1);
    memcpy(&g.ClipboardHandlerData[0], text, (size_t)(text_end - text));
    g.ClipboardHandlerData[(int)(text_end - text)] = 0;
}